

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

AggregateFunction * duckdb::GetHistogramFunction<true>(LogicalType *type)

{
  PhysicalType PVar1;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *type_00;
  
  type_00 = in_RDI;
  PVar1 = LogicalType::InternalType(in_RSI);
  switch(PVar1) {
  case BOOL:
    GetMapType<duckdb::HistogramFunctor,bool,true>((LogicalType *)type_00);
    break;
  case UINT8:
    GetMapType<duckdb::HistogramFunctor,unsigned_char,true>((LogicalType *)type_00);
    break;
  case INT8:
    GetMapType<duckdb::HistogramFunctor,signed_char,true>((LogicalType *)type_00);
    break;
  case UINT16:
    GetMapType<duckdb::HistogramFunctor,unsigned_short,true>((LogicalType *)type_00);
    break;
  case INT16:
    GetMapType<duckdb::HistogramFunctor,short,true>((LogicalType *)type_00);
    break;
  case UINT32:
    GetMapType<duckdb::HistogramFunctor,unsigned_int,true>((LogicalType *)type_00);
    break;
  case INT32:
    GetMapType<duckdb::HistogramFunctor,int,true>((LogicalType *)type_00);
    break;
  case UINT64:
    GetMapType<duckdb::HistogramFunctor,unsigned_long,true>((LogicalType *)type_00);
    break;
  case INT64:
    GetMapType<duckdb::HistogramFunctor,long,true>((LogicalType *)type_00);
    break;
  case FLOAT:
    GetMapType<duckdb::HistogramFunctor,float,true>((LogicalType *)type_00);
    break;
  case DOUBLE:
    GetMapType<duckdb::HistogramFunctor,double,true>((LogicalType *)type_00);
    break;
  case VARCHAR:
    GetStringMapType<duckdb::HistogramStringFunctor,true>((LogicalType *)type_00);
    break;
  default:
    GetStringMapType<duckdb::HistogramGenericFunctor,true>((LogicalType *)type_00);
  }
  return in_RDI;
}

Assistant:

AggregateFunction GetHistogramFunction(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
		return GetMapType<HistogramFunctor, bool, IS_ORDERED>(type);
	case PhysicalType::UINT8:
		return GetMapType<HistogramFunctor, uint8_t, IS_ORDERED>(type);
	case PhysicalType::UINT16:
		return GetMapType<HistogramFunctor, uint16_t, IS_ORDERED>(type);
	case PhysicalType::UINT32:
		return GetMapType<HistogramFunctor, uint32_t, IS_ORDERED>(type);
	case PhysicalType::UINT64:
		return GetMapType<HistogramFunctor, uint64_t, IS_ORDERED>(type);
	case PhysicalType::INT8:
		return GetMapType<HistogramFunctor, int8_t, IS_ORDERED>(type);
	case PhysicalType::INT16:
		return GetMapType<HistogramFunctor, int16_t, IS_ORDERED>(type);
	case PhysicalType::INT32:
		return GetMapType<HistogramFunctor, int32_t, IS_ORDERED>(type);
	case PhysicalType::INT64:
		return GetMapType<HistogramFunctor, int64_t, IS_ORDERED>(type);
	case PhysicalType::FLOAT:
		return GetMapType<HistogramFunctor, float, IS_ORDERED>(type);
	case PhysicalType::DOUBLE:
		return GetMapType<HistogramFunctor, double, IS_ORDERED>(type);
	case PhysicalType::VARCHAR:
		return GetStringMapType<HistogramStringFunctor, IS_ORDERED>(type);
#endif
	default:
		return GetStringMapType<HistogramGenericFunctor, IS_ORDERED>(type);
	}
}